

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ushort uVar5;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar6 [16];
  __m128i res;
  __m128i pred;
  __m128i A4;
  __m128i A3;
  __m128i A2;
  __m128i bit_fix;
  __m128i A1;
  __m128i avg;
  __m128i sum;
  __m128i TL_lo;
  __m128i T_lo;
  __m128i L_lo;
  __m128i TL;
  __m128i T;
  __m128i src;
  __m128i L;
  __m128i zero;
  int i;
  int local_254;
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  byte local_138;
  byte bStack_137;
  byte bStack_136;
  byte bStack_135;
  byte bStack_134;
  byte bStack_133;
  byte bStack_132;
  byte bStack_131;
  byte local_118;
  byte bStack_117;
  byte bStack_116;
  byte bStack_115;
  byte bStack_114;
  byte bStack_113;
  byte bStack_112;
  byte bStack_111;
  byte local_f8;
  byte bStack_f7;
  byte bStack_f6;
  byte bStack_f5;
  byte bStack_f4;
  byte bStack_f3;
  byte bStack_f2;
  byte bStack_f1;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  ushort uStack_2e;
  ushort uStack_2c;
  ushort uStack_2a;
  
  for (local_254 = 0; local_254 + 2 <= in_EDX; local_254 = local_254 + 2) {
    uVar1 = *(undefined8 *)(in_RDI + (long)(local_254 + -1) * 4);
    uVar2 = *(undefined8 *)(in_RDI + (long)local_254 * 4);
    uVar3 = *(undefined8 *)(in_RSI + (long)local_254 * 4);
    uVar4 = *(undefined8 *)(in_RSI + (long)(local_254 + -1) * 4);
    local_f8 = (byte)uVar1;
    bStack_f7 = (byte)((ulong)uVar1 >> 8);
    bStack_f6 = (byte)((ulong)uVar1 >> 0x10);
    bStack_f5 = (byte)((ulong)uVar1 >> 0x18);
    bStack_f4 = (byte)((ulong)uVar1 >> 0x20);
    bStack_f3 = (byte)((ulong)uVar1 >> 0x28);
    bStack_f2 = (byte)((ulong)uVar1 >> 0x30);
    bStack_f1 = (byte)((ulong)uVar1 >> 0x38);
    local_118 = (byte)uVar3;
    bStack_117 = (byte)((ulong)uVar3 >> 8);
    bStack_116 = (byte)((ulong)uVar3 >> 0x10);
    bStack_115 = (byte)((ulong)uVar3 >> 0x18);
    bStack_114 = (byte)((ulong)uVar3 >> 0x20);
    bStack_113 = (byte)((ulong)uVar3 >> 0x28);
    bStack_112 = (byte)((ulong)uVar3 >> 0x30);
    bStack_111 = (byte)((ulong)uVar3 >> 0x38);
    local_138 = (byte)uVar4;
    bStack_137 = (byte)((ulong)uVar4 >> 8);
    bStack_136 = (byte)((ulong)uVar4 >> 0x10);
    bStack_135 = (byte)((ulong)uVar4 >> 0x18);
    bStack_134 = (byte)((ulong)uVar4 >> 0x20);
    bStack_133 = (byte)((ulong)uVar4 >> 0x28);
    bStack_132 = (byte)((ulong)uVar4 >> 0x30);
    bStack_131 = (byte)((ulong)uVar4 >> 0x38);
    uStack_76 = (ushort)bStack_117;
    uStack_74 = (ushort)bStack_116;
    uStack_72 = (ushort)bStack_115;
    uStack_6e = (ushort)bStack_113;
    uStack_6c = (ushort)bStack_112;
    uStack_6a = (ushort)bStack_111;
    uStack_86 = (ushort)bStack_f7;
    uStack_84 = (ushort)bStack_f6;
    uStack_82 = (ushort)bStack_f5;
    uStack_7e = (ushort)bStack_f3;
    uStack_7c = (ushort)bStack_f2;
    uStack_7a = (ushort)bStack_f1;
    uVar5 = (ushort)((ushort)local_118 + (ushort)local_f8) >> 1;
    uVar7 = (ushort)(uStack_76 + uStack_86) >> 1;
    uVar8 = (ushort)(uStack_74 + uStack_84) >> 1;
    uVar9 = (ushort)(uStack_72 + uStack_82) >> 1;
    uVar10 = (ushort)((ushort)bStack_114 + (ushort)bStack_f4) >> 1;
    uVar11 = (ushort)(uStack_6e + uStack_7e) >> 1;
    uVar12 = (ushort)(uStack_6c + uStack_7c) >> 1;
    uVar13 = (ushort)(uStack_6a + uStack_7a) >> 1;
    uStack_c6 = (ushort)bStack_137;
    uStack_c4 = (ushort)bStack_136;
    uStack_c2 = (ushort)bStack_135;
    uStack_be = (ushort)bStack_133;
    uStack_bc = (ushort)bStack_132;
    uStack_ba = (ushort)bStack_131;
    uStack_36 = (ushort)bStack_137;
    uStack_34 = (ushort)bStack_136;
    uStack_32 = (ushort)bStack_135;
    uStack_2e = (ushort)bStack_133;
    uStack_2c = (ushort)bStack_132;
    uStack_2a = (ushort)bStack_131;
    auVar6._2_2_ = (uVar7 - uStack_c6) + (ushort)(uVar7 < uStack_36);
    auVar6._0_2_ = (uVar5 - local_138) + (ushort)(uVar5 < local_138);
    auVar6._4_2_ = (uVar8 - uStack_c4) + (ushort)(uVar8 < uStack_34);
    auVar6._6_2_ = (uVar9 - uStack_c2) + (ushort)(uVar9 < uStack_32);
    auVar6._10_2_ = (uVar11 - uStack_be) + (ushort)(uVar11 < uStack_2e);
    auVar6._8_2_ = (uVar10 - bStack_134) + (ushort)(uVar10 < bStack_134);
    auVar6._12_2_ = (uVar12 - uStack_bc) + (ushort)(uVar12 < uStack_2c);
    auVar6._14_2_ = (uVar13 - uStack_ba) + (ushort)(uVar13 < uStack_2a);
    auVar6 = psraw(auVar6,ZEXT416(1));
    local_a8 = auVar6._0_2_;
    sStack_a6 = auVar6._2_2_;
    sStack_a4 = auVar6._4_2_;
    sStack_a2 = auVar6._6_2_;
    sStack_a0 = auVar6._8_2_;
    sStack_9e = auVar6._10_2_;
    sStack_9c = auVar6._12_2_;
    sStack_9a = auVar6._14_2_;
    local_a8 = uVar5 + local_a8;
    sStack_a6 = uVar7 + sStack_a6;
    sStack_a4 = uVar8 + sStack_a4;
    sStack_a2 = uVar9 + sStack_a2;
    sStack_a0 = uVar10 + sStack_a0;
    sStack_9e = uVar11 + sStack_9e;
    sStack_9c = uVar12 + sStack_9c;
    sStack_9a = uVar13 + sStack_9a;
    local_208 = (char)uVar2;
    cStack_207 = (char)((ulong)uVar2 >> 8);
    cStack_206 = (char)((ulong)uVar2 >> 0x10);
    cStack_205 = (char)((ulong)uVar2 >> 0x18);
    cStack_204 = (char)((ulong)uVar2 >> 0x20);
    cStack_203 = (char)((ulong)uVar2 >> 0x28);
    cStack_202 = (char)((ulong)uVar2 >> 0x30);
    cStack_201 = (char)((ulong)uVar2 >> 0x38);
    *(ulong *)(in_RCX + (long)local_254 * 4) =
         CONCAT17(cStack_201 -
                  ((0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a)),
                  CONCAT16(cStack_202 -
                           ((0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c -
                           (0xff < sStack_9c)),
                           CONCAT15(cStack_203 -
                                    ((0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e -
                                    (0xff < sStack_9e)),
                                    CONCAT14(cStack_204 -
                                             ((0 < sStack_a0) * (sStack_a0 < 0x100) *
                                              (char)sStack_a0 - (0xff < sStack_a0)),
                                             CONCAT13(cStack_205 -
                                                      ((0 < sStack_a2) * (sStack_a2 < 0x100) *
                                                       (char)sStack_a2 - (0xff < sStack_a2)),
                                                      CONCAT12(cStack_206 -
                                                               ((0 < sStack_a4) *
                                                                (sStack_a4 < 0x100) *
                                                                (char)sStack_a4 - (0xff < sStack_a4)
                                                               ),CONCAT11(cStack_207 -
                                                                          ((0 < sStack_a6) *
                                                                           (sStack_a6 < 0x100) *
                                                                           (char)sStack_a6 -
                                                                          (0xff < sStack_a6)),
                                                                          local_208 -
                                                                          ((0 < local_a8) *
                                                                           (local_a8 < 0x100) *
                                                                           (char)local_a8 -
                                                                          (0xff < local_a8)))))))));
  }
  if (local_254 != in_EDX) {
    (*VP8LPredictorsSub_C[0xd])
              ((uint32_t *)(in_RDI + (long)local_254 * 4),(uint32_t *)(in_RSI + (long)local_254 * 4)
               ,in_EDX - local_254,(uint32_t *)(in_RCX + (long)local_254 * 4));
  }
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 2 <= num_pixels; i += 2) {
    // we can only process two pixels at a time
    const __m128i L = _mm_loadl_epi64((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadl_epi64((const __m128i*)&in[i]);
    const __m128i T = _mm_loadl_epi64((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadl_epi64((const __m128i*)&upper[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i sum = _mm_add_epi16(T_lo, L_lo);
    const __m128i avg = _mm_srli_epi16(sum, 1);
    const __m128i A1 = _mm_sub_epi16(avg, TL_lo);
    const __m128i bit_fix = _mm_cmpgt_epi16(TL_lo, avg);
    const __m128i A2 = _mm_sub_epi16(A1, bit_fix);
    const __m128i A3 = _mm_srai_epi16(A2, 1);
    const __m128i A4 = _mm_add_epi16(avg, A3);
    const __m128i pred = _mm_packus_epi16(A4, A4);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storel_epi64((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}